

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O0

rbtree_node_base * eastl::RBTreeRotateLeft(rbtree_node_base *pNode,rbtree_node_base *pNodeRoot)

{
  this_type *ptVar1;
  rbtree_node_base *pNodeTemp;
  rbtree_node_base *pNodeRoot_local;
  rbtree_node_base *pNode_local;
  
  ptVar1 = pNode->mpNodeRight;
  pNode->mpNodeRight = ptVar1->mpNodeLeft;
  if (ptVar1->mpNodeLeft != (this_type *)0x0) {
    ptVar1->mpNodeLeft->mpNodeParent = pNode;
  }
  ptVar1->mpNodeParent = pNode->mpNodeParent;
  pNodeTemp = ptVar1;
  if (pNode != pNodeRoot) {
    if (pNode == pNode->mpNodeParent->mpNodeLeft) {
      pNode->mpNodeParent->mpNodeLeft = ptVar1;
      pNodeTemp = pNodeRoot;
    }
    else {
      pNode->mpNodeParent->mpNodeRight = ptVar1;
      pNodeTemp = pNodeRoot;
    }
  }
  ptVar1->mpNodeLeft = pNode;
  pNode->mpNodeParent = ptVar1;
  return pNodeTemp;
}

Assistant:

rbtree_node_base* RBTreeRotateLeft(rbtree_node_base* pNode, rbtree_node_base* pNodeRoot)
    {
        rbtree_node_base* const pNodeTemp = pNode->mpNodeRight;

        pNode->mpNodeRight = pNodeTemp->mpNodeLeft;

        if(pNodeTemp->mpNodeLeft)
            pNodeTemp->mpNodeLeft->mpNodeParent = pNode;
        pNodeTemp->mpNodeParent = pNode->mpNodeParent;
        
        if(pNode == pNodeRoot)
            pNodeRoot = pNodeTemp;
        else if(pNode == pNode->mpNodeParent->mpNodeLeft)
            pNode->mpNodeParent->mpNodeLeft = pNodeTemp;
        else
            pNode->mpNodeParent->mpNodeRight = pNodeTemp;

        pNodeTemp->mpNodeLeft = pNode;
        pNode->mpNodeParent = pNodeTemp;

        return pNodeRoot;
    }